

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QObject_*>::reallocateAndGrow
          (QArrayDataPointer<QObject_*> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QObject_*> *old)

{
  long lVar1;
  bool bVar2;
  QObject **ppQVar3;
  QPodArrayOps<QObject_*> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<QObject_*> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QObject_*> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  QArrayDataPointer<QObject_*> *in_stack_ffffffffffffff70;
  QArrayDataPointer<QObject_*> *in_stack_ffffffffffffff78;
  QArrayDataPointer<QObject_*> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach(in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QObject_*> *)&DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (ppQVar3 = data((QArrayDataPointer<QObject_*> *)&stack0xffffffffffffffe0),
       ppQVar3 == (QObject **)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_00409134;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<QObject_*> *)
                  operator->((QArrayDataPointer<QObject_*> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QObject_*> *)0x409047);
        begin((QArrayDataPointer<QObject_*> *)0x409056);
        QtPrivate::QPodArrayOps<QObject_*>::copyAppend
                  (this_00,(QObject **)in_stack_ffffffffffffff78,
                   (QObject **)in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (QArrayDataPointer<QObject_*> *)
             operator->((QArrayDataPointer<QObject_*> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QObject_*> *)0x40908f);
        begin((QArrayDataPointer<QObject_*> *)0x40909e);
        QtPrivate::QPodArrayOps<QObject_*>::moveAppend
                  ((QPodArrayOps<QObject_*> *)in_stack_ffffffffffffff70,
                   (QObject **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (QObject **)0x4090bc);
      }
    }
    swap(in_stack_ffffffffffffff70,
         (QArrayDataPointer<QObject_*> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff70,
           (QArrayDataPointer<QObject_*> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff70);
    freeSpaceAtEnd(in_stack_ffffffffffffff78);
    QtPrivate::QPodArrayOps<QObject_*>::reallocate
              ((QPodArrayOps<QObject_*> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00409134:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }